

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O2

VectorNd __thiscall HermiteSpline<5U,_2U>::interpolate(HermiteSpline<5U,_2U> *this,double s)

{
  double dVar1;
  long *in_RSI;
  double dVar2;
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> PVar3;
  
  dVar1 = *(double *)(*in_RSI + 0x60);
  while ((dVar1 < s && (in_RSI[1] != *in_RSI))) {
    s = s - dVar1;
  }
  dVar2 = 1.0;
  if (s <= 1.0) {
    dVar2 = s;
  }
  PVar3.m_storage.m_data.array =
       (DenseStorage<double,_2,_2,_1,_0>)
       UnitBoundedPolynomial<5U,_2U>::interpolate
                 ((UnitBoundedPolynomial<5U,_2U> *)this,dVar2 / dVar1);
  return (PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>)
         (PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>)PVar3.m_storage.m_data.array;
}

Assistant:

typename HermiteSpline<Order, Dims>::VectorNd HermiteSpline<Order, Dims>::interpolate(double s)
{
    int m = 0;
    double s_ = s;

    while (s_ > children[m].length && m < children.size())
    {
        s_ -= children[m].length;
    }

    if (s_ >= 1.0)
    {
        s_ = 1.0;
    }

    return children[m].interpolate(s_ / children[m].length);
}